

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O1

size_t quicly_send_close_invalid_token
                 (quicly_context_t *ctx,uint32_t protocol_version,ptls_iovec_t dest_cid,
                 ptls_iovec_t src_cid,char *err_desc,void *datagram)

{
  void *__dest;
  size_t sVar1;
  ptls_iovec_t salt;
  long lVar2;
  int iVar3;
  undefined1 *puVar4;
  ptls_cipher_suite_t *cs;
  uint8_t *puVar5;
  size_t __n;
  size_t __n_00;
  uint8_t *puVar6;
  uint8_t *base;
  ptls_iovec_t pVar7;
  st_quicly_cipher_context_t egress;
  
  __n = dest_cid.len;
  __n_00 = src_cid.len;
  egress.aead = (ptls_aead_context_t *)0x0;
  egress.header_protection = (ptls_cipher_context_t *)0x0;
  puVar4 = (uint8_t *)0x0;
  if (protocol_version == 0xff00001b) {
    puVar4 = get_salt_draft27;
  }
  puVar5 = get_salt_current;
  if (protocol_version != 0xff00001d) {
    puVar5 = puVar4;
  }
  puVar6 = (uint8_t *)0xffffffffffffffff;
  if (puVar5 != (uint8_t *)0x0) {
    cs = get_aes128gcmsha256(ctx);
    salt.len = 0x14;
    salt.base = puVar5;
    iVar3 = setup_initial_encryption
                      (cs,(st_quicly_cipher_context_t *)0x0,&egress,src_cid,0,salt,
                       (quicly_conn_t *)0x0);
    if (iVar3 == 0) {
      *(undefined1 *)datagram = 0xc1;
      *(char *)((long)datagram + 1) = (char)(protocol_version >> 0x18);
      *(char *)((long)datagram + 2) = (char)(protocol_version >> 0x10);
      *(char *)((long)datagram + 3) = (char)(protocol_version >> 8);
      *(char *)((long)datagram + 4) = (char)protocol_version;
      *(char *)((long)datagram + 5) = (char)dest_cid.len;
      memcpy((void *)((long)datagram + 6),dest_cid.base,__n);
      __dest = (void *)((long)datagram + __n + 7);
      *(char *)((long)__dest + -1) = (char)src_cid.len;
      memcpy(__dest,src_cid.base,__n_00);
      lVar2 = __n_00 + __n + 6;
      base = (uint8_t *)((long)datagram + lVar2 + 5);
      *(undefined1 *)((long)datagram + lVar2 + 1) = 0;
      *(undefined2 *)((long)datagram + lVar2 + 3) = 0;
      puVar5 = quicly_encode_close_frame(base,0xb,0,err_desc);
      sVar1 = (egress.aead)->algo->tag_size;
      puVar6 = puVar5 + (sVar1 - (long)datagram);
      if (0x4b0 < (long)puVar6) {
        __assert_fail("dst - (uint8_t *)datagram <= QUICLY_MIN_CLIENT_INITIAL_SIZE",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x11a2,
                      "size_t quicly_send_close_invalid_token(quicly_context_t *, uint32_t, ptls_iovec_t, ptls_iovec_t, const char *, void *)"
                     );
      }
      puVar4 = (undefined1 *)((long)datagram + __n_00 + __n + 6 + 2);
      if (0x3f < (long)(puVar5 + ~(ulong)puVar4 + sVar1)) {
        __assert_fail("dst - length_at - 1 < 64",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                      ,0x11a3,
                      "size_t quicly_send_close_invalid_token(quicly_context_t *, uint32_t, ptls_iovec_t, ptls_iovec_t, const char *, void *)"
                     );
      }
      *puVar4 = (char)(puVar5 + ~(ulong)puVar4 + sVar1);
      pVar7.len = (size_t)puVar6;
      pVar7.base = (uint8_t *)datagram;
      (*quicly_default_crypto_engine.encrypt_packet)
                (&quicly_default_crypto_engine,(quicly_conn_t *)0x0,egress.header_protection,
                 egress.aead,pVar7,0,(long)base - (long)datagram,0,0);
      ptls_aead_free(egress.aead);
      ptls_cipher_free(egress.header_protection);
    }
  }
  return (size_t)puVar6;
}

Assistant:

size_t quicly_send_close_invalid_token(quicly_context_t *ctx, uint32_t protocol_version, ptls_iovec_t dest_cid,
                                       ptls_iovec_t src_cid, const char *err_desc, void *datagram)
{
    struct st_quicly_cipher_context_t egress = {};
    const struct st_ptls_salt_t *salt;

    /* setup keys */
    if ((salt = get_salt(protocol_version)) == NULL)
        return SIZE_MAX;
    if (setup_initial_encryption(get_aes128gcmsha256(ctx), NULL, &egress, src_cid, 0,
                                 ptls_iovec_init(salt->initial, sizeof(salt->initial)), NULL) != 0)
        return SIZE_MAX;

    uint8_t *dst = datagram, *length_at;

    /* build packet */
    PTLS_BUILD_ASSERT(QUICLY_SEND_PN_SIZE == 2);
    *dst++ = QUICLY_PACKET_TYPE_INITIAL | 0x1 /* 2-byte PN */;
    dst = quicly_encode32(dst, protocol_version);
    *dst++ = dest_cid.len;
    memcpy(dst, dest_cid.base, dest_cid.len);
    dst += dest_cid.len;
    *dst++ = src_cid.len;
    memcpy(dst, src_cid.base, src_cid.len);
    dst += src_cid.len;
    *dst++ = 0;        /* token_length = 0 */
    length_at = dst++; /* length_at to be filled in later as 1-byte varint */
    *dst++ = 0;        /* PN = 0 */
    *dst++ = 0;        /* ditto */
    uint8_t *payload_from = dst;
    dst = quicly_encode_close_frame(dst, QUICLY_ERROR_GET_ERROR_CODE(QUICLY_TRANSPORT_ERROR_INVALID_TOKEN),
                                    QUICLY_FRAME_TYPE_PADDING, err_desc);

    /* determine the size of the packet, make adjustments */
    dst += egress.aead->algo->tag_size;
    assert(dst - (uint8_t *)datagram <= QUICLY_MIN_CLIENT_INITIAL_SIZE);
    assert(dst - length_at - 1 < 64);
    *length_at = dst - length_at - 1;
    size_t datagram_len = dst - (uint8_t *)datagram;

    /* encrypt packet */
    quicly_default_crypto_engine.encrypt_packet(&quicly_default_crypto_engine, NULL, egress.header_protection, egress.aead,
                                                ptls_iovec_init(datagram, datagram_len), 0, payload_from - (uint8_t *)datagram, 0,
                                                0);

    dispose_cipher(&egress);
    return datagram_len;
}